

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O0

RPCHelpMan * wallet::listunspent(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffc9c8;
  allocator<RPCArg> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  allocator<RPCResult> *paVar4;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffc9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc9d8;
  undefined4 in_stack_ffffffffffffc9e0;
  VType in_stack_ffffffffffffc9e4;
  UniValue *in_stack_ffffffffffffc9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffca00;
  UniValue *in_stack_ffffffffffffca08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffca10;
  undefined7 in_stack_ffffffffffffca18;
  undefined1 in_stack_ffffffffffffca1f;
  string *in_stack_ffffffffffffca20;
  undefined7 in_stack_ffffffffffffca28;
  undefined1 in_stack_ffffffffffffca2f;
  undefined4 in_stack_ffffffffffffca30;
  Type in_stack_ffffffffffffca34;
  string *in_stack_ffffffffffffca38;
  undefined4 in_stack_ffffffffffffca40;
  Type in_stack_ffffffffffffca44;
  undefined4 in_stack_ffffffffffffca48;
  Type in_stack_ffffffffffffca4c;
  RPCArg *in_stack_ffffffffffffca50;
  RPCArgOptions *in_stack_ffffffffffffca70;
  undefined1 *local_3528;
  undefined1 *local_3510;
  undefined1 *local_34f8;
  RPCExamples *in_stack_ffffffffffffcb10;
  RPCResults *in_stack_ffffffffffffcb18;
  undefined1 *puVar5;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffcb20;
  string *in_stack_ffffffffffffcb28;
  string *in_stack_ffffffffffffcb30;
  RPCHelpMan *in_stack_ffffffffffffcb38;
  undefined1 *local_34b0;
  RPCMethodImpl *fun;
  undefined1 local_2fe8 [39];
  allocator<char> local_2fc1;
  allocator<char> local_2fc0;
  allocator<char> local_2fbf;
  allocator<char> local_2fbe;
  allocator<char> local_2fbd;
  allocator<char> local_2fbc;
  allocator<char> local_2fbb [3];
  pointer local_2fb8;
  pointer pRStack_2fb0;
  undefined1 local_2fa8 [14];
  allocator<char> local_2f9a [32];
  allocator<char> local_2f7a;
  allocator<char> local_2f79 [31];
  allocator<char> local_2f5a;
  allocator<char> local_2f59 [9];
  undefined8 uStack_2f50;
  _Alloc_hider local_2f48;
  allocator<char> local_2f3a;
  allocator<char> local_2f39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f38;
  undefined1 local_2f28 [14];
  undefined1 local_2f1a [10];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f10;
  allocator<char> local_2efa;
  allocator<char> local_2ef9;
  pointer local_2ef8;
  pointer pbStack_2ef0;
  undefined8 local_2ee8;
  allocator<char> local_2eda;
  allocator<char> local_2ed9;
  undefined8 local_2ed8;
  undefined8 uStack_2ed0;
  undefined8 local_2ec8;
  allocator<char> local_2eba;
  allocator<char> local_2eb9;
  undefined8 local_2eb8;
  undefined8 uStack_2eb0;
  undefined8 local_2ea8;
  allocator<char> local_2e9a;
  allocator<char> local_2e99;
  undefined8 local_2e98;
  undefined8 uStack_2e90;
  undefined8 local_2e88;
  allocator<char> local_2e79;
  undefined8 local_2e78;
  undefined8 uStack_2e70;
  undefined8 local_2e68;
  allocator<char> local_2e5a;
  allocator<char> local_2e59;
  undefined8 local_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  allocator<char> local_2e3a;
  allocator<char> local_2e39;
  undefined8 local_2e38;
  undefined8 uStack_2e30;
  undefined8 local_2e28;
  allocator<char> local_2e1a;
  allocator<char> local_2e19;
  undefined8 local_2e18;
  undefined8 uStack_2e10;
  undefined8 local_2e08;
  allocator<char> local_2df9;
  undefined8 local_2df8;
  undefined8 uStack_2df0;
  undefined8 local_2de8;
  allocator<char> local_2dda;
  allocator<char> local_2dd9;
  undefined8 local_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  allocator<char> local_2dba;
  allocator<char> local_2db9;
  undefined8 local_2db8;
  undefined8 uStack_2db0;
  undefined8 local_2da8;
  allocator<char> local_2d9a;
  allocator<char> local_2d99;
  undefined8 local_2d98;
  undefined8 uStack_2d90;
  undefined8 local_2d88;
  allocator<char> local_2d7a;
  allocator<char> local_2d79;
  undefined8 local_2d78;
  undefined8 uStack_2d70;
  undefined8 local_2d68;
  allocator<char> local_2d5a;
  allocator<char> local_2d59 [31];
  allocator<char> local_2d3a;
  allocator<char> local_2d39 [31];
  allocator<char> local_2d1a;
  allocator<char> local_2d19 [28];
  allocator<char> local_2cfd [2];
  allocator<char> local_2cfb;
  undefined1 local_2cfa;
  allocator<char> local_2cf9;
  allocator<char> local_2cf8;
  allocator<char> local_2cf7;
  allocator<char> local_2cf6;
  allocator<char> local_2cf5;
  allocator<char> local_2cf4;
  allocator<char> local_2cf3;
  allocator<char> local_2cf2;
  allocator<char> local_2cf1 [28];
  allocator<char> local_2cd5;
  undefined4 local_2cd4;
  allocator<char> local_2cce;
  allocator<char> local_2ccd;
  undefined1 local_2ccc;
  allocator<char> local_2ccb [2];
  allocator<char> local_2cc9;
  undefined4 local_2cc8;
  allocator<char> local_2cc1 [30];
  allocator<char> local_2ca3;
  allocator<char> local_2ca2;
  allocator<char> local_2ca1;
  undefined4 local_2ca0;
  allocator<char> local_2c9a;
  allocator<char> local_2c99;
  undefined4 local_2c98;
  allocator<char> local_2c91 [31];
  allocator<char> local_2c72;
  allocator<char> local_2c71 [961];
  undefined1 local_28b0 [136];
  undefined1 local_2828 [1120];
  undefined1 local_23c8 [968];
  undefined8 local_2000;
  undefined1 local_1a38 [64];
  undefined1 local_19f8 [136];
  undefined1 local_1970 [200];
  allocator<RPCArg> local_18a8 [40];
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 local_1870;
  undefined1 local_1868;
  undefined1 local_1867;
  undefined1 local_1860;
  undefined8 local_1838;
  undefined8 uStack_1830;
  undefined8 local_1828;
  undefined1 local_1820;
  undefined1 local_181f;
  undefined1 local_1720;
  undefined8 local_16f8;
  undefined8 uStack_16f0;
  undefined8 local_16e8;
  undefined1 local_16e0;
  undefined1 local_16df;
  undefined1 local_15f8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined1 local_15b8;
  undefined1 local_15b7;
  undefined1 local_14f0;
  undefined8 local_14c8;
  undefined8 uStack_14c0;
  undefined8 local_14b8;
  undefined1 local_14b0;
  undefined1 local_14af;
  undefined1 local_13c8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined1 local_1388;
  undefined1 local_1387;
  undefined1 local_1248 [584];
  undefined8 local_1000;
  undefined1 local_d20 [160];
  undefined1 local_c80;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined1 local_c40;
  undefined1 local_c3f;
  allocator<RPCArg> local_b40 [40];
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined1 local_b00;
  undefined1 local_aff;
  undefined1 local_af8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined1 local_ab8;
  undefined1 local_ab7;
  undefined1 local_a10 [264];
  undefined1 local_908 [280];
  undefined1 local_7f0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined1 local_7b0;
  undefined1 local_7af;
  undefined1 local_6b0;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined1 local_670;
  undefined1 local_66f;
  undefined1 local_570 [1320];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2c98 = 1;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffca08,(int *)in_stack_ffffffffffffca00);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_6b0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_688 = 0;
  uStack_680 = 0;
  local_678 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc9c8);
  local_670 = 0;
  local_66f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2ca0 = 9999999;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffca08,(int *)in_stack_ffffffffffffca00);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_7f0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_7c8 = 0;
  uStack_7c0 = 0;
  local_7b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc9c8);
  local_7b0 = 0;
  local_7af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  UniValue::UniValue(in_stack_ffffffffffffc9e8,in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9d8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2cc8 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,&in_stack_ffffffffffffc9d0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_af8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_ad0 = 0;
  uStack_ac8 = 0;
  local_ac0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc9c8);
  local_ab8 = 0;
  local_ab7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffc9c8);
  __l._M_len._0_7_ = in_stack_ffffffffffffca18;
  __l._M_array = (iterator)in_stack_ffffffffffffca10;
  __l._M_len._7_1_ = in_stack_ffffffffffffca1f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffca08,__l,
             (allocator_type *)in_stack_ffffffffffffca00);
  local_b40[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_b18 = 0;
  uStack_b10 = 0;
  local_b08 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffc9c8);
  local_b00 = 0;
  local_aff = 0;
  paVar2 = local_b40;
  RPCArg::RPCArg(in_stack_ffffffffffffca50,
                 (string *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
                 in_stack_ffffffffffffca44,(Fallback *)in_stack_ffffffffffffca38,
                 (string *)CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2ccc = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffca08,(bool *)in_stack_ffffffffffffca00);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_c80 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_c58 = 0;
  uStack_c50 = 0;
  local_c48 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_c40 = 0;
  local_c3f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2cd4 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,&in_stack_ffffffffffffc9d0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  FormatMoney_abi_cxx11_((CAmount)in_stack_ffffffffffffca20);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffca08,in_stack_ffffffffffffca00);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  local_13c8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_13a0 = 0;
  uStack_1398 = 0;
  local_1390 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1388 = 0;
  local_1387 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc9d0);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  local_14f0 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_14c8 = 0;
  uStack_14c0 = 0;
  local_14b8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_14b0 = 0;
  local_14af = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_15f8 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_15d0 = 0;
  uStack_15c8 = 0;
  local_15c0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_15b8 = 0;
  local_15b7 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffc9d0);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  local_1720 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_16f8 = 0;
  uStack_16f0 = 0;
  local_16e8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_16e0 = 0;
  local_16df = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2cfa = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffca08,(bool *)in_stack_ffffffffffffca00);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffc9d8,in_stack_ffffffffffffc9d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_1860 = 0;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0));
  local_1838 = 0;
  uStack_1830 = 0;
  local_1828 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1820 = 0;
  local_181f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
                 in_stack_ffffffffffffca38,in_stack_ffffffffffffca34,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca20,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18));
  std::allocator<RPCArg>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffca18;
  __l_00._M_array = (iterator)in_stack_ffffffffffffca10;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffca1f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffca08,__l_00,
             (allocator_type *)in_stack_ffffffffffffca00);
  local_18a8[0] = (allocator<RPCArg>)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_1880 = 0;
  uStack_1878 = 0;
  local_1870 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)paVar2);
  local_1868 = 0;
  local_1867 = 0;
  paVar2 = local_18a8;
  RPCArg::RPCArg(in_stack_ffffffffffffca50,
                 (string *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
                 in_stack_ffffffffffffca44,(Fallback *)in_stack_ffffffffffffca38,
                 (string *)CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
                 in_stack_ffffffffffffca70);
  std::allocator<RPCArg>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffca18;
  __l_01._M_array = (iterator)in_stack_ffffffffffffca10;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffca1f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffca08,__l_01,
             (allocator_type *)in_stack_ffffffffffffca00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2d78 = 0;
  uStack_2d70 = 0;
  local_2d68 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2d98 = 0;
  uStack_2d90 = 0;
  local_2d88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2db8 = 0;
  uStack_2db0 = 0;
  local_2da8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2dd8 = 0;
  uStack_2dd0 = 0;
  local_2dc8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2df8 = 0;
  uStack_2df0 = 0;
  local_2de8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  local_2e18 = 0;
  uStack_2e10 = 0;
  local_2e08 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2e38 = 0;
  uStack_2e30 = 0;
  local_2e28 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2e58 = 0;
  uStack_2e50 = 0;
  local_2e48 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2e78 = 0;
  uStack_2e70 = 0;
  local_2e68 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  local_2e98 = 0;
  uStack_2e90 = 0;
  local_2e88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2eb8 = 0;
  uStack_2eb0 = 0;
  local_2ea8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2ed8 = 0;
  uStack_2ed0 = 0;
  local_2ec8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2ef8 = (pointer)0x0;
  pbStack_2ef0 = (pointer)0x0;
  local_2ee8._0_1_ = false;
  local_2ee8._1_1_ = false;
  local_2ee8._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2f1a._2_8_ = 0;
  aStack_2f10._M_allocated_capacity = 0;
  aStack_2f10._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  fun = (RPCMethodImpl *)local_2f1a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2f38._M_allocated_capacity = 0;
  local_2f38._8_8_ = 0;
  local_2f28._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2f59[1] = (allocator<char>)0x0;
  local_2f59[2] = (allocator<char>)0x0;
  local_2f59[3] = (allocator<char>)0x0;
  local_2f59[4] = (allocator<char>)0x0;
  local_2f59[5] = (allocator<char>)0x0;
  local_2f59[6] = (allocator<char>)0x0;
  local_2f59[7] = (allocator<char>)0x0;
  local_2f59[8] = (allocator<char>)0x0;
  uStack_2f50._0_1_ = '\0';
  uStack_2f50._1_7_ = 0;
  local_2f48._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar4 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2f9a[2] = (allocator<char>)0x0;
  local_2f9a[3] = (allocator<char>)0x0;
  local_2f9a[4] = (allocator<char>)0x0;
  local_2f9a[5] = (allocator<char>)0x0;
  local_2f9a[6] = (allocator<char>)0x0;
  local_2f9a[7] = (allocator<char>)0x0;
  local_2f9a[8] = (allocator<char>)0x0;
  local_2f9a[9] = (allocator<char>)0x0;
  local_2f9a[10] = (allocator<char>)0x0;
  local_2f9a[0xb] = (allocator<char>)0x0;
  local_2f9a[0xc] = (allocator<char>)0x0;
  local_2f9a[0xd] = (allocator<char>)0x0;
  local_2f9a[0xe] = (allocator<char>)0x0;
  local_2f9a[0xf] = (allocator<char>)0x0;
  local_2f9a[0x10] = (allocator<char>)0x0;
  local_2f9a[0x11] = (allocator<char>)0x0;
  local_2f9a[0x12] = (allocator<char>)0x0;
  local_2f9a[0x13] = (allocator<char>)0x0;
  local_2f9a[0x14] = (allocator<char>)0x0;
  local_2f9a[0x15] = (allocator<char>)0x0;
  local_2f9a[0x16] = (allocator<char>)0x0;
  local_2f9a[0x17] = (allocator<char>)0x0;
  local_2f9a[0x18] = (allocator<char>)0x0;
  local_2f9a[0x19] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar4);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffca18;
  __l_02._M_array = (iterator)in_stack_ffffffffffffca10;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffca1f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca08,__l_02,
             (allocator_type *)in_stack_ffffffffffffca00);
  paVar4 = (allocator<RPCResult> *)((ulong)paVar4 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             in_stack_ffffffffffffca44,in_stack_ffffffffffffca38,
             SUB41(in_stack_ffffffffffffca34 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffca2f,in_stack_ffffffffffffca28),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca20,
             (bool)in_stack_ffffffffffffca1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  local_2fb8 = (pointer)0x0;
  pRStack_2fb0 = (pointer)0x0;
  local_2fa8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar4);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffca18;
  __l_03._M_array = (iterator)in_stack_ffffffffffffca10;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffca1f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca08,__l_03,
             (allocator_type *)in_stack_ffffffffffffca00);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  std::allocator<RPCResult>::allocator(paVar4);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffca18;
  __l_04._M_array = (iterator)in_stack_ffffffffffffca10;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffca1f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffca08,__l_04,
             (allocator_type *)in_stack_ffffffffffffca00);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffca50,in_stack_ffffffffffffca4c,
             (string *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40),
             in_stack_ffffffffffffca38,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffca34,in_stack_ffffffffffffca30),
             (bool)in_stack_ffffffffffffca2f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffca4c,in_stack_ffffffffffffca48),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffca44,in_stack_ffffffffffffca40));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  HelpExampleCli(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 in_stack_ffffffffffffc9d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  HelpExampleCli(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::operator+(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
                 in_stack_ffffffffffffca10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 in_stack_ffffffffffffc9d8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffc9e4,in_stack_ffffffffffffc9e0),
                 (char *)in_stack_ffffffffffffc9d8);
  HelpExampleRpc(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::operator+(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  HelpExampleCli(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::operator+(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffca1f,in_stack_ffffffffffffca18),
             (char *)in_stack_ffffffffffffca10,(allocator<char> *)in_stack_ffffffffffffca08);
  HelpExampleRpc(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  std::operator+(in_stack_ffffffffffffca00,in_stack_ffffffffffffc9f8);
  RPCExamples::RPCExamples((RPCExamples *)paVar4,(string *)0xc61afd);
  this = (RPCArg *)local_2fe8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listunspent()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffc9d8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffc9d0);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffcb38,in_stack_ffffffffffffcb30,in_stack_ffffffffffffcb28,
             in_stack_ffffffffffffcb20,in_stack_ffffffffffffcb18,in_stack_ffffffffffffcb10,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2fe8 + 0x26));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2fc1);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2fc0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2fbf);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2fbe);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2fbd);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2fbc);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2fbb);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_34b0 = local_1970;
  do {
    local_34b0 = local_34b0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_34b0 != local_19f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar5 = local_23c8;
  puVar1 = local_1a38;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar5);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2fa8 + 0xd));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2f9a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar5 = local_28b0;
  puVar1 = local_2828;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar5);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2f7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2f79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2f5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2f59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2f3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2f39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_2f1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2f1a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2efa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ef9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2eda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ed9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2eba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2eb9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e59);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2e19);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2df9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dd9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2dba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2db9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d79);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffc9d8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d59);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d39);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2d1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2d19);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc9d8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_34f8 = local_48;
  do {
    local_34f8 = local_34f8 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_34f8 != local_570);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::allocator<char>::~allocator(local_2cfd);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc9d8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3510 = local_d20;
  do {
    local_3510 = local_3510 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3510 != local_1248);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cfb);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf9);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf7);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf6);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf5);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf3);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cf2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2cf1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cd5);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cce);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ccd);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2ccb);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffc9d8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_3528 = local_908;
  do {
    local_3528 = local_3528 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_3528 != local_a10);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2cc9);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2cc1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ca3);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ca2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2ca1);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2c9a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2c99);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2c91);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2c72);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2c71);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listunspent()
{
    return RPCHelpMan{
                "listunspent",
                "\nReturns array of unspent transaction outputs\n"
                "with between minconf and maxconf (inclusive) confirmations.\n"
                "Optionally filter to only include txouts paid to specified addresses.\n",
                {
                    {"minconf", RPCArg::Type::NUM, RPCArg::Default{1}, "The minimum confirmations to filter"},
                    {"maxconf", RPCArg::Type::NUM, RPCArg::Default{9999999}, "The maximum confirmations to filter"},
                    {"addresses", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "The bitcoin addresses to filter",
                        {
                            {"address", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "bitcoin address"},
                        },
                    },
                    {"include_unsafe", RPCArg::Type::BOOL, RPCArg::Default{true}, "Include outputs that are not safe to spend\n"
                              "See description of \"safe\" attribute below."},
                    {"query_options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "",
                        {
                            {"minimumAmount", RPCArg::Type::AMOUNT, RPCArg::Default{FormatMoney(0)}, "Minimum value of each UTXO in " + CURRENCY_UNIT + ""},
                            {"maximumAmount", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"unlimited"}, "Maximum value of each UTXO in " + CURRENCY_UNIT + ""},
                            {"maximumCount", RPCArg::Type::NUM, RPCArg::DefaultHint{"unlimited"}, "Maximum number of UTXOs"},
                            {"minimumSumAmount", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"unlimited"}, "Minimum sum value of all UTXOs in " + CURRENCY_UNIT + ""},
                            {"include_immature_coinbase", RPCArg::Type::BOOL, RPCArg::Default{false}, "Include immature coinbase UTXOs"}
                        },
                        RPCArgOptions{.oneline_description="query_options"}},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "txid", "the transaction id"},
                            {RPCResult::Type::NUM, "vout", "the vout value"},
                            {RPCResult::Type::STR, "address", /*optional=*/true, "the bitcoin address"},
                            {RPCResult::Type::STR, "label", /*optional=*/true, "The associated label, or \"\" for the default label"},
                            {RPCResult::Type::STR, "scriptPubKey", "the output script"},
                            {RPCResult::Type::STR_AMOUNT, "amount", "the transaction output amount in " + CURRENCY_UNIT},
                            {RPCResult::Type::NUM, "confirmations", "The number of confirmations"},
                            {RPCResult::Type::NUM, "ancestorcount", /*optional=*/true, "The number of in-mempool ancestor transactions, including this one (if transaction is in the mempool)"},
                            {RPCResult::Type::NUM, "ancestorsize", /*optional=*/true, "The virtual transaction size of in-mempool ancestors, including this one (if transaction is in the mempool)"},
                            {RPCResult::Type::STR_AMOUNT, "ancestorfees", /*optional=*/true, "The total fees of in-mempool ancestors (including this one) with fee deltas used for mining priority in " + CURRENCY_ATOM + " (if transaction is in the mempool)"},
                            {RPCResult::Type::STR_HEX, "redeemScript", /*optional=*/true, "The redeem script if the output script is P2SH"},
                            {RPCResult::Type::STR, "witnessScript", /*optional=*/true, "witness script if the output script is P2WSH or P2SH-P2WSH"},
                            {RPCResult::Type::BOOL, "spendable", "Whether we have the private keys to spend this output"},
                            {RPCResult::Type::BOOL, "solvable", "Whether we know how to spend this output, ignoring the lack of keys"},
                            {RPCResult::Type::BOOL, "reused", /*optional=*/true, "(only present if avoid_reuse is set) Whether this output is reused/dirty (sent to an address that was previously spent from)"},
                            {RPCResult::Type::STR, "desc", /*optional=*/true, "(only when solvable) A descriptor for spending this output"},
                            {RPCResult::Type::ARR, "parent_descs", /*optional=*/false, "List of parent descriptors for the output script of this coin.", {
                                {RPCResult::Type::STR, "desc", "The descriptor string."},
                            }},
                            {RPCResult::Type::BOOL, "safe", "Whether this output is considered safe to spend. Unconfirmed transactions\n"
                                                            "from outside keys and unconfirmed replacement transactions are considered unsafe\n"
                                                            "and are not eligible for spending by fundrawtransaction and sendtoaddress."},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("listunspent", "")
            + HelpExampleCli("listunspent", "6 9999999 \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"")
            + HelpExampleRpc("listunspent", "6, 9999999 \"[\\\"" + EXAMPLE_ADDRESS[0] + "\\\",\\\"" + EXAMPLE_ADDRESS[1] + "\\\"]\"")
            + HelpExampleCli("listunspent", "6 9999999 '[]' true '{ \"minimumAmount\": 0.005 }'")
            + HelpExampleRpc("listunspent", "6, 9999999, [] , true, { \"minimumAmount\": 0.005 } ")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    int nMinDepth = 1;
    if (!request.params[0].isNull()) {
        nMinDepth = request.params[0].getInt<int>();
    }

    int nMaxDepth = 9999999;
    if (!request.params[1].isNull()) {
        nMaxDepth = request.params[1].getInt<int>();
    }

    std::set<CTxDestination> destinations;
    if (!request.params[2].isNull()) {
        UniValue inputs = request.params[2].get_array();
        for (unsigned int idx = 0; idx < inputs.size(); idx++) {
            const UniValue& input = inputs[idx];
            CTxDestination dest = DecodeDestination(input.get_str());
            if (!IsValidDestination(dest)) {
                throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, std::string("Invalid Bitcoin address: ") + input.get_str());
            }
            if (!destinations.insert(dest).second) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, std::string("Invalid parameter, duplicated address: ") + input.get_str());
            }
        }
    }

    bool include_unsafe = true;
    if (!request.params[3].isNull()) {
        include_unsafe = request.params[3].get_bool();
    }

    CoinFilterParams filter_coins;
    filter_coins.min_amount = 0;

    if (!request.params[4].isNull()) {
        const UniValue& options = request.params[4].get_obj();

        RPCTypeCheckObj(options,
            {
                {"minimumAmount", UniValueType()},
                {"maximumAmount", UniValueType()},
                {"minimumSumAmount", UniValueType()},
                {"maximumCount", UniValueType(UniValue::VNUM)},
                {"include_immature_coinbase", UniValueType(UniValue::VBOOL)}
            },
            true, true);

        if (options.exists("minimumAmount"))
            filter_coins.min_amount = AmountFromValue(options["minimumAmount"]);

        if (options.exists("maximumAmount"))
            filter_coins.max_amount = AmountFromValue(options["maximumAmount"]);

        if (options.exists("minimumSumAmount"))
            filter_coins.min_sum_amount = AmountFromValue(options["minimumSumAmount"]);

        if (options.exists("maximumCount"))
            filter_coins.max_count = options["maximumCount"].getInt<int64_t>();

        if (options.exists("include_immature_coinbase")) {
            filter_coins.include_immature_coinbase = options["include_immature_coinbase"].get_bool();
        }
    }

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    UniValue results(UniValue::VARR);
    std::vector<COutput> vecOutputs;
    {
        CCoinControl cctl;
        cctl.m_avoid_address_reuse = false;
        cctl.m_min_depth = nMinDepth;
        cctl.m_max_depth = nMaxDepth;
        cctl.m_include_unsafe_inputs = include_unsafe;
        LOCK(pwallet->cs_wallet);
        vecOutputs = AvailableCoinsListUnspent(*pwallet, &cctl, filter_coins).All();
    }

    LOCK(pwallet->cs_wallet);

    const bool avoid_reuse = pwallet->IsWalletFlagSet(WALLET_FLAG_AVOID_REUSE);

    for (const COutput& out : vecOutputs) {
        CTxDestination address;
        const CScript& scriptPubKey = out.txout.scriptPubKey;
        bool fValidAddress = ExtractDestination(scriptPubKey, address);
        bool reused = avoid_reuse && pwallet->IsSpentKey(scriptPubKey);

        if (destinations.size() && (!fValidAddress || !destinations.count(address)))
            continue;

        UniValue entry(UniValue::VOBJ);
        entry.pushKV("txid", out.outpoint.hash.GetHex());
        entry.pushKV("vout", (int)out.outpoint.n);

        if (fValidAddress) {
            entry.pushKV("address", EncodeDestination(address));

            const auto* address_book_entry = pwallet->FindAddressBookEntry(address);
            if (address_book_entry) {
                entry.pushKV("label", address_book_entry->GetLabel());
            }

            std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);
            if (provider) {
                if (scriptPubKey.IsPayToScriptHash()) {
                    const CScriptID hash = ToScriptID(std::get<ScriptHash>(address));
                    CScript redeemScript;
                    if (provider->GetCScript(hash, redeemScript)) {
                        entry.pushKV("redeemScript", HexStr(redeemScript));
                        // Now check if the redeemScript is actually a P2WSH script
                        CTxDestination witness_destination;
                        if (redeemScript.IsPayToWitnessScriptHash()) {
                            bool extracted = ExtractDestination(redeemScript, witness_destination);
                            CHECK_NONFATAL(extracted);
                            // Also return the witness script
                            const WitnessV0ScriptHash& whash = std::get<WitnessV0ScriptHash>(witness_destination);
                            CScriptID id{RIPEMD160(whash)};
                            CScript witnessScript;
                            if (provider->GetCScript(id, witnessScript)) {
                                entry.pushKV("witnessScript", HexStr(witnessScript));
                            }
                        }
                    }
                } else if (scriptPubKey.IsPayToWitnessScriptHash()) {
                    const WitnessV0ScriptHash& whash = std::get<WitnessV0ScriptHash>(address);
                    CScriptID id{RIPEMD160(whash)};
                    CScript witnessScript;
                    if (provider->GetCScript(id, witnessScript)) {
                        entry.pushKV("witnessScript", HexStr(witnessScript));
                    }
                }
            }
        }

        entry.pushKV("scriptPubKey", HexStr(scriptPubKey));
        entry.pushKV("amount", ValueFromAmount(out.txout.nValue));
        entry.pushKV("confirmations", out.depth);
        if (!out.depth) {
            size_t ancestor_count, descendant_count, ancestor_size;
            CAmount ancestor_fees;
            pwallet->chain().getTransactionAncestry(out.outpoint.hash, ancestor_count, descendant_count, &ancestor_size, &ancestor_fees);
            if (ancestor_count) {
                entry.pushKV("ancestorcount", uint64_t(ancestor_count));
                entry.pushKV("ancestorsize", uint64_t(ancestor_size));
                entry.pushKV("ancestorfees", uint64_t(ancestor_fees));
            }
        }
        entry.pushKV("spendable", out.spendable);
        entry.pushKV("solvable", out.solvable);
        if (out.solvable) {
            std::unique_ptr<SigningProvider> provider = pwallet->GetSolvingProvider(scriptPubKey);
            if (provider) {
                auto descriptor = InferDescriptor(scriptPubKey, *provider);
                entry.pushKV("desc", descriptor->ToString());
            }
        }
        PushParentDescriptors(*pwallet, scriptPubKey, entry);
        if (avoid_reuse) entry.pushKV("reused", reused);
        entry.pushKV("safe", out.safe);
        results.push_back(std::move(entry));
    }

    return results;
},
    };
}